

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O1

int lj_cf_table_foreach(lua_State *L)

{
  uint uVar1;
  anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 aVar2;
  TValue *pTVar3;
  int iVar4;
  
  pTVar3 = L->base;
  if ((L->top <= pTVar3) || ((pTVar3->field_2).it != 0xfffffff4)) {
    lj_err_argt(L,1,5);
  }
  if ((pTVar3 + 1 < L->top) && (*(int *)((long)pTVar3 + 0xc) == -9)) {
    uVar1 = (pTVar3->u32).lo;
    aVar2 = pTVar3[1].field_2.field_0;
    L->top = pTVar3 + 3;
    *(undefined4 *)((long)pTVar3 + 0x14) = 0xffffffff;
    iVar4 = lj_tab_next(L,(GCtab *)(ulong)uVar1,L->top + -1);
    while( true ) {
      if (iVar4 == 0) {
        return 0;
      }
      L->top[2] = *L->top;
      L->top[1] = L->top[-1];
      pTVar3 = L->top;
      (pTVar3->field_2).field_0 = aVar2;
      (pTVar3->field_2).it = 0xfffffff7;
      pTVar3 = L->top;
      L->top = pTVar3 + 3;
      lj_vm_call(L,pTVar3 + 1,2);
      pTVar3 = L->top;
      if (*(int *)((long)pTVar3 + -4) != -1) break;
      L->top = pTVar3 + -1;
      iVar4 = lj_tab_next(L,(GCtab *)(ulong)uVar1,pTVar3 + -2);
    }
    return 1;
  }
  lj_err_argt(L,2,6);
}

Assistant:

LJLIB_CF(table_foreach)
{
  GCtab *t = lj_lib_checktab(L, 1);
  GCfunc *func = lj_lib_checkfunc(L, 2);
  L->top = L->base+3;
  setnilV(L->top-1);
  while (lj_tab_next(L, t, L->top-1)) {
    copyTV(L, L->top+2, L->top);
    copyTV(L, L->top+1, L->top-1);
    setfuncV(L, L->top, func);
    L->top += 3;
    lua_call(L, 2, 1);
    if (!tvisnil(L->top-1))
      return 1;
    L->top--;
  }
  return 0;
}